

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CMoveStatement *statement)

{
  initializer_list<const_IRT::INode_*> __l;
  allocator local_101;
  string local_100 [32];
  ChildrenAnswers local_e0;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_b0;
  undefined1 local_98 [8];
  ChildrenAnswers answers;
  allocator<const_IRT::INode_*> local_51;
  INode *local_50;
  CExpression *local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  CMoveStatement *statement_local;
  PrintVisitor *this_local;
  
  children.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)statement;
  local_50 = (INode *)CMoveStatement::Target(statement);
  local_48 = CMoveStatement::Source
                       ((CMoveStatement *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_40 = &local_50;
  local_38 = 2;
  std::allocator<const_IRT::INode_*>::allocator(&local_51);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30,__l,
             &local_51);
  std::allocator<const_IRT::INode_*>::~allocator(&local_51);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&local_b0,(vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_98,this,&local_b0);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector(&local_b0);
  ChildrenAnswers::ChildrenAnswers(&local_e0,(ChildrenAnswers *)local_98);
  AddChildrenAnswers(this,&local_e0);
  ChildrenAnswers::~ChildrenAnswers(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"Move",&local_101);
  AddLabel(this,(string *)local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_98);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CMoveStatement &statement ) {
    std::vector<const IRT::INode *> children = { statement.Target( ), statement.Source( ) };
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "Move" );
    ++lastVisited;
}